

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

value * __thiscall cppcms::json::value::find(value *this,char *cpath)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
  *this_00;
  const_iterator cVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  string_key path;
  char local_70 [16];
  key_type local_60;
  
  pcVar4 = cpath + -1;
  do {
    pcVar1 = pcVar4 + 1;
    pcVar4 = pcVar4 + 1;
  } while (*pcVar1 != '\0');
  local_70[0] = '\0';
  if ((find(char_const*)::empty == '\0') &&
     (iVar3 = __cxa_guard_acquire(&find(char_const*)::empty), iVar3 != 0)) {
    find::empty.d.d.ptr_ = (copyable)operator_new(0x38);
    *(undefined8 *)((long)find::empty.d.d.ptr_ + 0x20) = 0;
    *(undefined8 *)((long)find::empty.d.d.ptr_ + 0x28) = 0;
    *(undefined8 *)((long)find::empty.d.d.ptr_ + 0x10) = 0;
    *(undefined8 *)((long)find::empty.d.d.ptr_ + 0x18) = 0;
    *(undefined8 *)find::empty.d.d.ptr_ = 0;
    *(undefined8 *)((long)find::empty.d.d.ptr_ + 8) = 0;
    *(undefined8 *)((long)find::empty.d.d.ptr_ + 0x30) = 0;
    __cxa_atexit(~value,&find::empty,&__dso_handle);
    __cxa_guard_release(&find(char_const*)::empty);
  }
  paVar2 = &local_60.key_.field_2;
  uVar7 = 0;
  while( true ) {
    pcVar5 = cpath;
    pcVar1 = pcVar4;
    if (cpath == (char *)0x0) {
      pcVar5 = local_70;
      pcVar1 = local_70;
    }
    uVar9 = (long)pcVar1 - (long)pcVar5;
    if (uVar9 <= uVar7) break;
    local_60.begin_ = pcVar5 + uVar7;
    uVar8 = uVar7;
    do {
      if (pcVar5[uVar8] == '.') break;
      uVar8 = uVar8 + 1;
    } while (uVar8 <= uVar9);
    uVar10 = uVar8 + 1;
    if (uVar9 <= uVar8) {
      uVar8 = 0xffffffffffffffff;
      uVar10 = 0xffffffffffffffff;
    }
    local_60.end_ = pcVar5 + uVar8;
    if ((ulong)((long)pcVar1 - (long)local_60.begin_) < uVar8 - uVar7) {
      local_60.end_ = pcVar1;
    }
    local_60.key_._M_string_length = 0;
    local_60.key_.field_2._M_local_buf[0] = '\0';
    if (((pcVar5 == (char *)0x0) || (local_60.end_ == local_60.begin_)) ||
       ((*(variant **)this)->type != is_object)) break;
    local_60.key_._M_dataplus._M_p = (pointer)paVar2;
    this_00 = &variant::
               get<std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
                         (*(variant **)this)->_M_t;
    cVar6 = std::
            _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
            ::find(this_00,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.key_._M_dataplus._M_p != paVar2) {
      operator_delete(local_60.key_._M_dataplus._M_p);
    }
    if ((_Rb_tree_header *)cVar6._M_node == &(this_00->_M_impl).super__Rb_tree_header) break;
    this = (value *)&cVar6._M_node[2]._M_left;
    pcVar5 = cpath;
    pcVar1 = pcVar4;
    if (cpath == (char *)0x0) {
      pcVar5 = local_70;
      pcVar1 = local_70;
    }
    uVar7 = uVar10;
    if ((ulong)((long)pcVar1 - (long)pcVar5) <= uVar10) {
      return (value *)(_Base_ptr *)this;
    }
  }
  return &find::empty;
}

Assistant:

value const &value::find(char const *cpath) const
	{
		string_key path=string_key::unowned(cpath);
		static value const empty;
		value const *ptr=this;
		size_t pos=0;
		size_t new_pos;
		do {
			new_pos=path.find('.',pos);
			string_key const part=path.unowned_substr(pos,new_pos - pos);
			if(new_pos!=std::string::npos)
				new_pos++;
			if(part.empty())
				return empty;
			if(ptr->type()!=json::is_object)
				return empty;
			json::object const &obj=ptr->object();
			json::object::const_iterator p;
			if((p=obj.find(part))==obj.end())
				return empty;
			ptr=&p->second;
			pos=new_pos;

		} while(new_pos < path.size());
		return *ptr;
	}